

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonthDatatypeValidator.cpp
# Opt level: O3

XMLDateTime * __thiscall
xercesc_4_0::MonthDatatypeValidator::parse
          (MonthDatatypeValidator *this,XMLCh *content,MemoryManager *manager)

{
  XMLDateTime *this_00;
  
  this_00 = (XMLDateTime *)XMemory::operator_new(0x68,manager);
  XMLDateTime::XMLDateTime(this_00,content,manager);
  XMLDateTime::parseMonth(this_00);
  return this_00;
}

Assistant:

XMLDateTime* MonthDatatypeValidator::parse(const XMLCh* const content, MemoryManager* const manager)
{
    XMLDateTime *pRetDate = new (manager) XMLDateTime(content, manager);
    Janitor<XMLDateTime> jan(pRetDate);

    try
    {
        pRetDate->parseMonth();
    }
    catch(const OutOfMemoryException&)
    {
        jan.release();

        throw;
    }

    return jan.release();
}